

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::ZNames::ZNamesLoader::loadTimeZone
          (ZNamesLoader *this,UResourceBundle *zoneStrings,UnicodeString *tzID,UErrorCode *errorCode
          )

{
  char16_t cVar1;
  undefined4 length;
  int32_t i;
  int offset;
  UnicodeString uKey;
  char key [129];
  
  UnicodeString::UnicodeString(&uKey,tzID);
  offset = 0;
  while( true ) {
    length = uKey.fUnion.fFields.fLength;
    if (-1 < uKey.fUnion.fStackFields.fLengthAndFlags) {
      length = (int)uKey.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if ((int)length <= offset) break;
    cVar1 = UnicodeString::doCharAt(&uKey,offset);
    if (cVar1 == L'/') {
      UnicodeString::setCharAt(&uKey,offset,L':');
    }
    offset = offset + 1;
  }
  UnicodeString::extract(&uKey,0,length,key,0x81,kInvariant);
  loadNames(this,zoneStrings,key,errorCode);
  UnicodeString::~UnicodeString(&uKey);
  return;
}

Assistant:

void loadTimeZone(const UResourceBundle* zoneStrings, const UnicodeString& tzID, UErrorCode& errorCode) {
        // Replace "/" with ":".
        UnicodeString uKey(tzID);
        for (int32_t i = 0; i < uKey.length(); i++) {
            if (uKey.charAt(i) == (UChar)0x2F) {
                uKey.setCharAt(i, (UChar)0x3A);
            }
        }

        char key[ZID_KEY_MAX + 1];
        uKey.extract(0, uKey.length(), key, sizeof(key), US_INV);

        loadNames(zoneStrings, key, errorCode);
    }